

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_embedded.h
# Opt level: O0

void __thiscall trun::DynLibEmbedded::~DynLibEmbedded(DynLibEmbedded *this)

{
  DynLibEmbedded *this_local;
  
  (this->super_IDynLibrary)._vptr_IDynLibrary = (_func_int **)&PTR__DynLibEmbedded_001479f0;
  std::__cxx11::string::~string((string *)&this->name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(void_*)>_>_>
  ::~map(&this->testfuncs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->exports);
  IDynLibrary::~IDynLibrary(&this->super_IDynLibrary);
  return;
}

Assistant:

virtual ~DynLibEmbedded() = default;